

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O3

uint64_t al_get_audio_stream_played_samples(ALLEGRO_AUDIO_STREAM *stream)

{
  ALLEGRO_MUTEX *pAVar1;
  uint64_t uVar2;
  
  pAVar1 = (stream->spl).mutex;
  if (pAVar1 != (ALLEGRO_MUTEX *)0x0) {
    al_lock_mutex(pAVar1);
  }
  if ((stream->spl).spl_data.buffer.f32 == (float *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (long)(stream->spl).pos + (long)(stream->spl).spl_data.len * stream->consumed_fragments;
  }
  if (pAVar1 != (ALLEGRO_MUTEX *)0x0) {
    al_unlock_mutex(pAVar1);
  }
  return uVar2;
}

Assistant:

uint64_t al_get_audio_stream_played_samples(const ALLEGRO_AUDIO_STREAM *stream)
{
   uint64_t result;
   ALLEGRO_MUTEX *stream_mutex;
   ASSERT(stream);

   stream_mutex = maybe_lock_mutex(stream->spl.mutex);
   if (stream->spl.spl_data.buffer.ptr) {
      result = stream->consumed_fragments * stream->spl.spl_data.len +
         stream->spl.pos;
   }
   else {
      result = 0;
   }
   maybe_unlock_mutex(stream_mutex);

   return result;
}